

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Parser::parseObject(Parser *this,Builder *output)

{
  Builder builder_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  bool bVar7;
  char cVar8;
  uint index;
  Orphan<capnp::json::Value::Field> *pOVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  Orphanage OVar12;
  Range<unsigned_long> RVar13;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Builder object;
  undefined1 local_170 [8];
  Builder valueBuilder;
  ArrayPtr<const_char> local_130;
  undefined1 local_120 [8];
  BuilderFor<capnp::json::Value::Field> builder;
  Orphan<capnp::json::Value::Field> orphan;
  undefined1 local_d0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:721:5)>
  _kjDefer721;
  Fault f;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_long_&,_const_unsigned_long_&> _kjCondition;
  bool expectComma;
  undefined1 local_48 [8];
  Orphanage orphanage;
  Vector<capnp::Orphan<capnp::json::Value::Field>_> fields;
  Builder *output_local;
  Parser *this_local;
  
  kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::Vector
            ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&orphanage.capTable);
  uVar1 = (output->_builder).capTable;
  uVar2 = (output->_builder).data;
  uVar3 = (output->_builder).pointers;
  uVar4 = (output->_builder).dataSize;
  uVar5 = (output->_builder).pointerCount;
  uVar6 = *(undefined2 *)&(output->_builder).field_0x26;
  builder_00._builder.pointers._6_2_ = uVar6;
  builder_00._builder.pointers._4_2_ = uVar5;
  builder_00._builder.pointers._0_4_ = uVar4;
  builder_00._builder.data = (void *)uVar3;
  builder_00._builder.capTable = (CapTableBuilder *)uVar2;
  builder_00._builder.segment = (SegmentBuilder *)uVar1;
  builder_00._builder.dataSize = in_stack_fffffffffffffda0;
  builder_00._builder._36_4_ = in_stack_fffffffffffffda4;
  OVar12 = Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder_00);
  orphanage.arena = (BuilderArena *)OVar12.capTable;
  local_48 = (undefined1  [8])OVar12.arena;
  _kjCondition._35_1_ = 0;
  Input::consume(&this->input,'{');
  this->nestingDepth = this->nestingDepth + 1;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->nestingDepth);
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)local_b0,
             (DebugExpression<unsigned_long&> *)&f,&this->maxNestingDepth);
  bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar7) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
              ((Fault *)&_kjDefer721.maybeFunc.ptr.field_1.value,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x2d0,FAILED,"++nestingDepth <= maxNestingDepth",
               "_kjCondition,\"JSON message nested too deeply.\"",
               (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)local_b0,
               (char (*) [32])"JSON message nested too deeply.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer721.maybeFunc.ptr.field_1.value);
  }
  orphan.builder.location = (word *)this;
  kj::
  defer<capnp::(anonymous_namespace)::Parser::parseObject(capnp::json::Value::Builder&)::_lambda()_1_>
            ((kj *)local_d0,(Type *)&orphan.builder.location);
  while( true ) {
    Input::consumeWhitespace(&this->input);
    cVar8 = Input::nextChar(&this->input);
    if (cVar8 == '}') break;
    Orphanage::newOrphan<capnp::json::Value::Field>
              ((Orphan<capnp::json::Value::Field> *)&builder._builder.dataSize,(Orphanage *)local_48
              );
    Orphan<capnp::json::Value::Field>::get
              ((BuilderFor<capnp::json::Value::Field> *)local_120,
               (Orphan<capnp::json::Value::Field> *)&builder._builder.dataSize);
    if ((_kjCondition._35_1_ & 1) != 0) {
      Input::consumeWhitespace(&this->input);
      Input::consume(&this->input,',');
      Input::consumeWhitespace(&this->input);
    }
    consumeQuotedString((String *)&valueBuilder._builder.dataSize,this);
    Text::Reader::Reader((Reader *)&local_130,(String *)&valueBuilder._builder.dataSize);
    capnp::json::Value::Field::Builder::setName((Builder *)local_120,(Reader)local_130);
    kj::String::~String((String *)&valueBuilder._builder.dataSize);
    Input::consumeWhitespace(&this->input);
    Input::consume(&this->input,':');
    Input::consumeWhitespace(&this->input);
    capnp::json::Value::Field::Builder::getValue((Builder *)local_170,(Builder *)local_120);
    parseValue(this,(Builder *)local_170);
    pOVar9 = kj::mv<capnp::Orphan<capnp::json::Value::Field>>
                       ((Orphan<capnp::json::Value::Field> *)&builder._builder.dataSize);
    kj::Vector<capnp::Orphan<capnp::json::Value::Field>>::
    add<capnp::Orphan<capnp::json::Value::Field>>
              ((Vector<capnp::Orphan<capnp::json::Value::Field>> *)&orphanage.capTable,pOVar9);
    _kjCondition._35_1_ = 1;
    Orphan<capnp::json::Value::Field>::~Orphan
              ((Orphan<capnp::json::Value::Field> *)&builder._builder.dataSize);
  }
  sVar10 = kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::size
                     ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&orphanage.capTable);
  capnp::json::Value::Builder::initObject
            ((Builder *)&object.builder.structDataSize,output,(uint)sVar10);
  capnp::json::Value::Builder::getObject((Builder *)&__range2,output);
  RVar13 = kj::indices<kj::Vector<capnp::Orphan<capnp::json::Value::Field>>&>
                     ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&orphanage.capTable);
  __begin2.value = RVar13.begin_;
  __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar7 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    puVar11 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
    index = (uint)*puVar11;
    pOVar9 = kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::operator[]
                       ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&orphanage.capTable,
                        *puVar11);
    pOVar9 = kj::mv<capnp::Orphan<capnp::json::Value::Field>>(pOVar9);
    List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::adoptWithCaveats
              ((Builder *)&__range2,index,pOVar9);
    kj::Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  Input::consume(&this->input,'}');
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++:721:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:721:5)>
               *)local_d0);
  kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::~Vector
            ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&orphanage.capTable);
  return;
}

Assistant:

void parseObject(JsonValue::Builder& output) {
    kj::Vector<Orphan<JsonValue::Field>> fields;
    auto orphanage = Orphanage::getForMessageContaining(output);
    bool expectComma = false;

    input.consume('{');
    KJ_REQUIRE(++nestingDepth <= maxNestingDepth, "JSON message nested too deeply.");
    KJ_DEFER(--nestingDepth);

    while (input.consumeWhitespace(), input.nextChar() != '}') {
      auto orphan = orphanage.newOrphan<JsonValue::Field>();
      auto builder = orphan.get();

      if (expectComma) {
        input.consumeWhitespace();
        input.consume(',');
        input.consumeWhitespace();
      }

      builder.setName(consumeQuotedString());

      input.consumeWhitespace();
      input.consume(':');
      input.consumeWhitespace();

      auto valueBuilder = builder.getValue();
      parseValue(valueBuilder);

      fields.add(kj::mv(orphan));

      expectComma = true;
    }

    output.initObject(fields.size());
    auto object = output.getObject();

    for (auto i : kj::indices(fields)) {
      object.adoptWithCaveats(i, kj::mv(fields[i]));
    }

    input.consume('}');
  }